

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_linked_definitions_section.hpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::
linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::end_array(linked_definitions_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
            *this)

{
  vector<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
  *pvVar1;
  error_code eVar2;
  value_type *data;
  _Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false> local_30;
  _Head_base<0UL,_pstore::repo::linked_definitions_creation_dispatcher_*,_false> local_28;
  pointer local_20;
  pointer local_18;
  
  pvVar1 = (this->ld_).ptr_;
  local_18 = (pvVar1->
             super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_20 = (pvVar1->
             super__Vector_base<pstore::repo::linked_definitions::value_type,_std::allocator<pstore::repo::linked_definitions::value_type>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  std::
  make_unique<pstore::repo::linked_definitions_creation_dispatcher,pstore::repo::linked_definitions::value_type_const*const&,pstore::repo::linked_definitions::value_type_const*>
            ((value_type **)&local_28,&local_18);
  local_30._M_head_impl = &(local_28._M_head_impl)->super_section_creation_dispatcher;
  local_28._M_head_impl = (linked_definitions_creation_dispatcher *)0x0;
  std::
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  ::operator=((this->out_).ptr_,(value_type *)&local_30);
  if ((linked_definitions_creation_dispatcher *)local_30._M_head_impl !=
      (linked_definitions_creation_dispatcher *)0x0) {
    (*((section_creation_dispatcher *)&(local_30._M_head_impl)->_vptr_section_creation_dispatcher)->
      _vptr_section_creation_dispatcher[1])();
  }
  local_30._M_head_impl = (section_creation_dispatcher *)0x0;
  std::
  unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,_std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>_>
  ::~unique_ptr((unique_ptr<pstore::repo::linked_definitions_creation_dispatcher,_std::default_delete<pstore::repo::linked_definitions_creation_dispatcher>_>
                 *)&local_28);
  eVar2 = rule::pop(&this->super_rule);
  return eVar2;
}

Assistant:

std::error_code linked_definitions_section<OutputIterator>::end_array () {
                auto const * const data = ld_->data ();
                *out_ = std::make_unique<repo::linked_definitions_creation_dispatcher> (
                    data, data + ld_->size ());
                return pop ();
            }